

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree_test.cpp
# Opt level: O0

void __thiscall
PersistentSegtree_BasicUsage_Test::~PersistentSegtree_BasicUsage_Test
          (PersistentSegtree_BasicUsage_Test *this)

{
  PersistentSegtree_BasicUsage_Test *this_local;
  
  ~PersistentSegtree_BasicUsage_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentSegtree, BasicUsage) {
    int n = 10;
    vector<Segtree*> trees;
    vector<Naive*> naives;
    trees.push_back(new Segtree(0, n));
    naives.push_back(new Naive(n));
    compare(trees.back(), naives.back());
    
    vector<vector<int>> updates = {
        {2, 5, 2},
        {0, 1, 1},
        {0, 10, 4},
        {4, 8, 1},
    };
    
    for (auto &u : updates) {
        naives.push_back(naives.back()->rangeUpdate(u[0], u[1], u[2]));
        trees.push_back(trees.back()->rangeUpdate(u[0], u[1], u[2]));
        compare(trees.back(), naives.back());
    }
    // Check that the updates are non-destructive
    rep(i, 0, trees.size()) {
        compare(trees[i], naives[i]);
    }
}